

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_int64 StreamReadLine(io_private *pDev,char **pzData,jx9_int64 nMaxLen)

{
  char cVar1;
  uint uVar2;
  jx9_io_stream *pjVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  sxu32 sVar8;
  char *pcVar9;
  jx9_int64 jVar10;
  long lVar11;
  ulong uVar12;
  char zBuf [8192];
  undefined1 local_2038 [8200];
  
  if ((pDev->sBuffer).nByte <= pDev->nOfft) {
    (pDev->sBuffer).nByte = 0;
    uVar2 = (pDev->sBuffer).nFlags;
    if ((uVar2 & 4) != 0) {
      (pDev->sBuffer).pBlob = (void *)0x0;
      (pDev->sBuffer).mByte = 0;
      (pDev->sBuffer).nFlags = uVar2 & 0xfffffffb;
    }
    pDev->nOfft = 0;
  }
  pjVar3 = pDev->pStream;
  uVar2 = (pDev->sBuffer).nByte;
  uVar6 = pDev->nOfft;
  if (uVar2 != uVar6) {
    pcVar9 = (char *)((long)(pDev->sBuffer).pBlob + (ulong)uVar6);
    lVar11 = 0;
    do {
      cVar1 = pcVar9[lVar11];
      if (cVar1 == '\n') {
        uVar12 = lVar11 + 1;
        *pzData = pcVar9;
        goto LAB_00140d5f;
      }
      lVar5 = lVar11 + 1;
      lVar11 = lVar11 + 1;
    } while (pcVar9 + lVar5 < pcVar9 + (uVar2 - uVar6));
    uVar12 = 0;
LAB_00140d5f:
    if (cVar1 == '\n') {
      sVar8 = (int)uVar12 + uVar6;
      goto LAB_00140e91;
    }
  }
  jVar10 = 0x2000;
  if (nMaxLen - 1U < 0x1fff) {
    jVar10 = nMaxLen;
  }
  do {
    uVar7 = (*pjVar3->xRead)(pDev->pHandle,local_2038,jVar10);
    if ((long)uVar7 < 1) {
      uVar2 = (pDev->sBuffer).nByte;
      uVar6 = pDev->nOfft;
      if (uVar2 == uVar6) {
        return uVar7;
      }
      *pzData = (char *)((ulong)uVar6 + (long)(pDev->sBuffer).pBlob);
      uVar12 = (ulong)(uVar2 - uVar6);
      (pDev->sBuffer).nByte = 0;
      uVar2 = (pDev->sBuffer).nFlags;
      sVar8 = 0;
      if ((uVar2 & 4) != 0) {
        (pDev->sBuffer).pBlob = (void *)0x0;
        (pDev->sBuffer).mByte = 0;
        (pDev->sBuffer).nFlags = uVar2 & 0xfffffffb;
      }
      goto LAB_00140e91;
    }
    SyBlobAppend(&pDev->sBuffer,local_2038,(sxu32)uVar7);
    uVar2 = pDev->nOfft;
    uVar6 = (pDev->sBuffer).nByte - uVar2;
    uVar12 = (ulong)uVar6;
    if (uVar6 != 0) {
      pcVar9 = (char *)((long)(pDev->sBuffer).pBlob + (ulong)uVar2);
      lVar11 = 0;
      do {
        if (pcVar9[lVar11] == '\n') {
          uVar7 = lVar11 + 1;
          *pzData = pcVar9;
          bVar4 = true;
          goto LAB_00140df5;
        }
        lVar5 = lVar11 + 1;
        lVar11 = lVar11 + 1;
      } while (pcVar9 + lVar5 < pcVar9 + uVar12);
    }
    bVar4 = false;
LAB_00140df5:
    if (bVar4) {
      sVar8 = uVar2 + (int)uVar7;
      uVar12 = uVar7;
      goto LAB_00140e91;
    }
  } while ((long)uVar12 < nMaxLen || nMaxLen < 1);
  *pzData = (char *)((ulong)uVar2 + (long)(pDev->sBuffer).pBlob);
  (pDev->sBuffer).nByte = 0;
  uVar2 = (pDev->sBuffer).nFlags;
  sVar8 = 0;
  if ((uVar2 & 4) != 0) {
    (pDev->sBuffer).pBlob = (void *)0x0;
    (pDev->sBuffer).mByte = 0;
    (pDev->sBuffer).nFlags = uVar2 & 0xfffffffb;
  }
LAB_00140e91:
  pDev->nOfft = sVar8;
  return uVar12;
}

Assistant:

static jx9_int64 StreamReadLine(io_private *pDev, const char **pzData, jx9_int64 nMaxLen)
{
	const jx9_io_stream *pStream = pDev->pStream;
	char zBuf[8192];
	jx9_int64 n;
	sxi32 rc;
	n = 0;
	if( pDev->nOfft >= SyBlobLength(&pDev->sBuffer) ){
		/* Reset the working buffer so that we avoid excessive memory allocation */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Check if there is a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got line, update the cursor  */
			pDev->nOfft += (sxu32)n;
			return n;
		}
	}
	/* Perform the read operation until a new line is extracted or length
	 * limit is reached.
	 */
	for(;;){
		n = pStream->xRead(pDev->pHandle, zBuf, (nMaxLen > 0 && nMaxLen < sizeof(zBuf)) ? nMaxLen : sizeof(zBuf));
		if( n < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Append the data just read */
		SyBlobAppend(&pDev->sBuffer, zBuf, (sxu32)n);
		/* Try to extract a line */
		rc = GetLine(pDev, &n, pzData);
		if( rc == SXRET_OK ){
			/* Got one, return immediately */
			pDev->nOfft += (sxu32)n;
			return n;
		}
		if( nMaxLen > 0 && (SyBlobLength(&pDev->sBuffer) - pDev->nOfft >= nMaxLen) ){
			/* Read limit reached, return the available data */
			*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
			n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
			/* Reset the working buffer */
			SyBlobReset(&pDev->sBuffer);
			pDev->nOfft = 0;
			return n;
		}
	}
	if( SyBlobLength(&pDev->sBuffer) - pDev->nOfft > 0 ){
		/* Read limit reached, return the available data */
		*pzData = (const char *)SyBlobDataAt(&pDev->sBuffer, pDev->nOfft);
		n = SyBlobLength(&pDev->sBuffer) - pDev->nOfft;
		/* Reset the working buffer */
		SyBlobReset(&pDev->sBuffer);
		pDev->nOfft = 0;
	}
	return n;
}